

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16781328,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar1;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar2;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar3;
  BVH *bvh;
  undefined1 auVar4 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  long lVar8;
  size_t k;
  ulong uVar9;
  int iVar10;
  undefined8 unaff_RBP;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vfloat4 a0;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  Precalculations pre;
  TravRayK<4,_false> tray;
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    aVar1 = valid_i->field_0;
    auVar4 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar4 = vpcmpeqd_avx((undefined1  [16])aVar1,auVar4);
    iVar10 = vmovmskps_avx(auVar4);
    uVar11 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),iVar10);
    if (iVar10 != 0) {
      aVar2 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x40);
      aVar3 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x50);
      auVar4 = *(undefined1 (*) [16])(ray + 0x60);
      auVar18._0_4_ = auVar4._0_4_ * auVar4._0_4_;
      auVar18._4_4_ = auVar4._4_4_ * auVar4._4_4_;
      auVar18._8_4_ = auVar4._8_4_ * auVar4._8_4_;
      auVar18._12_4_ = auVar4._12_4_ * auVar4._12_4_;
      auVar22 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar3,(undefined1  [16])aVar3);
      auVar18 = vfmadd231ps_fma(auVar22,(undefined1  [16])aVar2,(undefined1  [16])aVar2);
      auVar22 = vrsqrtps_avx(auVar18);
      fVar21 = auVar22._0_4_;
      fVar25 = auVar22._4_4_;
      fVar26 = auVar22._8_4_;
      fVar27 = auVar22._12_4_;
      auVar19._0_4_ = fVar21 * fVar21 * fVar21 * auVar18._0_4_ * -0.5;
      auVar19._4_4_ = fVar25 * fVar25 * fVar25 * auVar18._4_4_ * -0.5;
      auVar19._8_4_ = fVar26 * fVar26 * fVar26 * auVar18._8_4_ * -0.5;
      auVar19._12_4_ = fVar27 * fVar27 * fVar27 * auVar18._12_4_ * -0.5;
      auVar28._8_4_ = 0x3fc00000;
      auVar28._0_8_ = 0x3fc000003fc00000;
      auVar28._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vfmadd213ps_fma(auVar28,auVar22,auVar19);
      auVar20._8_4_ = 0x80000000;
      auVar20._0_8_ = 0x8000000080000000;
      auVar20._12_4_ = 0x80000000;
      auVar22._12_4_ = 0;
      auVar22._0_12_ = ZEXT812(0);
      auVar22 = auVar22 << 0x20;
      uVar9 = uVar11;
      while (uVar9 != 0) {
        lVar8 = 0;
        for (uVar12 = uVar9; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
          lVar8 = lVar8 + 1;
        }
        uVar12 = (ulong)(uint)((int)lVar8 * 4);
        auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar12 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar12 + 0x50)),0x1c);
        auVar18 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + uVar12 + 0x60)),0x28);
        fVar21 = *(float *)((long)pre.ray_space + (uVar12 - 0x10));
        auVar32._0_4_ = auVar18._0_4_ * fVar21;
        auVar32._4_4_ = auVar18._4_4_ * fVar21;
        auVar32._8_4_ = auVar18._8_4_ * fVar21;
        auVar32._12_4_ = auVar18._12_4_ * fVar21;
        auVar19 = vshufpd_avx(auVar32,auVar32,1);
        auVar18 = vmovshdup_avx(auVar32);
        auVar28 = vunpckhps_avx(auVar32,auVar22);
        auVar13 = vshufps_avx(auVar28,ZEXT416(auVar18._0_4_ ^ 0x80000000),0x41);
        auVar34._0_8_ = auVar19._0_8_ ^ 0x8000000080000000;
        auVar34._8_8_ = auVar19._8_8_ ^ auVar20._8_8_;
        auVar28 = vinsertps_avx(auVar34,auVar32,0x2a);
        auVar18 = vdpps_avx(auVar13,auVar13,0x7f);
        auVar19 = vdpps_avx(auVar28,auVar28,0x7f);
        auVar18 = vcmpps_avx(auVar19,auVar18,1);
        auVar37._0_4_ = auVar18._0_4_;
        auVar37._4_4_ = auVar37._0_4_;
        auVar37._8_4_ = auVar37._0_4_;
        auVar37._12_4_ = auVar37._0_4_;
        auVar18 = vblendvps_avx(auVar28,auVar13,auVar37);
        auVar19 = vdpps_avx(auVar18,auVar18,0x7f);
        auVar28 = vrsqrtss_avx(auVar19,auVar19);
        fVar25 = auVar28._0_4_;
        fVar25 = fVar25 * 1.5 - auVar19._0_4_ * 0.5 * fVar25 * fVar25 * fVar25;
        auVar35._0_4_ = auVar18._0_4_ * fVar25;
        auVar35._4_4_ = auVar18._4_4_ * fVar25;
        auVar35._8_4_ = auVar18._8_4_ * fVar25;
        auVar35._12_4_ = auVar18._12_4_ * fVar25;
        auVar18 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar19 = vshufps_avx(auVar32,auVar32,0xc9);
        auVar38._0_4_ = auVar35._0_4_ * auVar19._0_4_;
        auVar38._4_4_ = auVar35._4_4_ * auVar19._4_4_;
        auVar38._8_4_ = auVar35._8_4_ * auVar19._8_4_;
        auVar38._12_4_ = auVar35._12_4_ * auVar19._12_4_;
        auVar18 = vfmsub231ps_fma(auVar38,auVar32,auVar18);
        auVar28 = vshufps_avx(auVar18,auVar18,0xc9);
        auVar18 = vdpps_avx(auVar28,auVar28,0x7f);
        uVar9 = uVar9 - 1 & uVar9;
        auVar19 = vrsqrtss_avx(auVar18,auVar18);
        fVar25 = auVar19._0_4_;
        fVar25 = fVar25 * 1.5 - auVar18._0_4_ * 0.5 * fVar25 * fVar25 * fVar25;
        auVar36._0_4_ = fVar25 * auVar28._0_4_;
        auVar36._4_4_ = fVar25 * auVar28._4_4_;
        auVar36._8_4_ = fVar25 * auVar28._8_4_;
        auVar36._12_4_ = fVar25 * auVar28._12_4_;
        auVar30._0_4_ = fVar21 * auVar32._0_4_;
        auVar30._4_4_ = fVar21 * auVar32._4_4_;
        auVar30._8_4_ = fVar21 * auVar32._8_4_;
        auVar30._12_4_ = fVar21 * auVar32._12_4_;
        auVar28 = vunpcklps_avx(auVar35,auVar30);
        auVar18 = vunpckhps_avx(auVar35,auVar30);
        auVar13 = vunpcklps_avx(auVar36,auVar22);
        auVar19 = vunpckhps_avx(auVar36,auVar22);
        aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar18,auVar19);
        aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar28,auVar13);
        aVar5 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar28,auVar13);
        pre.ray_space[lVar8].vx.field_0 = aVar7;
        pre.ray_space[lVar8].vy.field_0 = aVar5;
        pre.ray_space[lVar8].vz.field_0 = aVar6;
      }
      auVar22 = vpcmpeqd_avx(auVar20,auVar20);
      auVar20 = vpcmpeqd_avx((undefined1  [16])aVar1,auVar22);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      auVar29._8_4_ = 0x7fffffff;
      auVar29._0_8_ = 0x7fffffff7fffffff;
      auVar29._12_4_ = 0x7fffffff;
      auVar22 = vandps_avx((undefined1  [16])aVar2,auVar29);
      auVar33._8_4_ = 0x219392ef;
      auVar33._0_8_ = 0x219392ef219392ef;
      auVar33._12_4_ = 0x219392ef;
      auVar22 = vcmpps_avx(auVar22,auVar33,1);
      auVar18 = vblendvps_avx((undefined1  [16])aVar2,auVar33,auVar22);
      auVar22 = vandps_avx((undefined1  [16])aVar3,auVar29);
      auVar22 = vcmpps_avx(auVar22,auVar33,1);
      auVar19 = vblendvps_avx((undefined1  [16])aVar3,auVar33,auVar22);
      auVar22 = vandps_avx(auVar4,auVar29);
      auVar22 = vcmpps_avx(auVar22,auVar33,1);
      auVar22 = vblendvps_avx(auVar4,auVar33,auVar22);
      auVar28 = vrcpps_avx(auVar18);
      auVar31._8_4_ = 0x3f800000;
      auVar31._0_8_ = 0x3f8000003f800000;
      auVar31._12_4_ = 0x3f800000;
      auVar18 = vfnmadd213ps_fma(auVar18,auVar28,auVar31);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar18,auVar28,auVar28)
      ;
      auVar18 = vrcpps_avx(auVar19);
      auVar19 = vfnmadd213ps_fma(auVar19,auVar18,auVar31);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar19,auVar18,auVar18)
      ;
      auVar18 = vrcpps_avx(auVar22);
      auVar22 = vfnmadd213ps_fma(auVar22,auVar18,auVar31);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar22,auVar18,auVar18)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      auVar18 = ZEXT416(0) << 0x20;
      auVar23._8_4_ = 0x20;
      auVar23._0_8_ = 0x2000000020;
      auVar23._12_4_ = 0x20;
      auVar22 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar18,1);
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar22,auVar23);
      auVar22 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar18,5);
      auVar15._8_4_ = 0x40;
      auVar15._0_8_ = 0x4000000040;
      auVar15._12_4_ = 0x40;
      auVar24._8_4_ = 0x60;
      auVar24._0_8_ = 0x6000000060;
      auVar24._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar24,auVar15,auVar22);
      auVar22 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar18,5);
      auVar14._8_4_ = 0x80;
      auVar14._0_8_ = 0x8000000080;
      auVar14._12_4_ = 0x80;
      auVar16._8_4_ = 0xa0;
      auVar16._0_8_ = 0xa0000000a0;
      auVar16._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar16,auVar14,auVar22);
      auVar22 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar18);
      auVar18 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar18);
      auVar17._8_4_ = 0x7f800000;
      auVar17._0_8_ = 0x7f8000007f800000;
      auVar17._12_4_ = 0x7f800000;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar17,auVar22,auVar20);
      auVar13._8_4_ = 0xff800000;
      auVar13._0_8_ = 0xff800000ff800000;
      auVar13._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar13,auVar18,auVar20);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)(undefined1  [16])aVar2;
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)(undefined1  [16])aVar3;
      tray.dir.field_0._32_16_ = auVar4;
      for (; uVar11 != 0; uVar11 = uVar11 - 1 & uVar11) {
        k = 0;
        for (uVar9 = uVar11; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
          k = k + 1;
        }
        intersect1(This,bvh,(NodeRef)(bvh->root).ptr,k,&pre,ray,&tray,context);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }